

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

Type __thiscall wabt::LocalTypes::operator[](LocalTypes *this,Index i)

{
  pointer ppVar1;
  Enum in_EAX;
  pointer ppVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  ppVar2 = (this->decls_).
           super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->decls_).
           super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = ppVar2 == ppVar1;
  if (bVar5) {
    uVar4 = 0;
  }
  else {
    uVar3 = 0;
    do {
      uVar4 = ppVar2->second + uVar3;
      if (i < uVar4) {
        in_EAX = (ppVar2->first).enum_;
        uVar4 = uVar3;
        break;
      }
      ppVar2 = ppVar2 + 1;
      bVar5 = ppVar2 == ppVar1;
      uVar3 = uVar4;
    } while (!bVar5);
  }
  if ((bVar5) && (in_EAX = Any, uVar4 <= i)) {
    __assert_fail("i < count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/ir.cc",
                  0xcb,"Type wabt::LocalTypes::operator[](Index) const");
  }
  return (Type)in_EAX;
}

Assistant:

Type LocalTypes::operator[](Index i) const {
  Index count = 0;
  for (auto decl: decls_) {
    if (i < count + decl.second) {
      return decl.first;
    }
    count += decl.second;
  }
  assert(i < count);
  return Type::Any;
}